

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_enc.c
# Opt level: O0

void VP8AdjustFilterStrength(VP8EncIterator *it)

{
  double dVar1;
  long *plVar2;
  int iVar3;
  long lVar4;
  long in_RDI;
  int level;
  int delta;
  VP8SegmentInfo *dqm;
  int s_1;
  int max_level;
  double v;
  double best_v;
  int best_level;
  int i;
  int s;
  VP8Encoder *enc;
  int local_38;
  int local_34;
  double local_28;
  int local_1c;
  int local_18;
  int local_14;
  
  plVar2 = *(long **)(in_RDI + 0x28);
  if (*(long *)(in_RDI + 0x140) == 0) {
    if (0 < *(int *)(*plVar2 + 0x20)) {
      local_34 = 0;
      for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
        lVar4 = (long)local_38 * 0x2e8;
        iVar3 = VP8FilterStrengthFromDelta
                          ((int)plVar2[3],
                           (int)((int)plVar2[(long)local_38 * 0x5d + 0xa2] *
                                (uint)*(ushort *)((long)plVar2 + lVar4 + 0x342)) >> 3);
        if (*(int *)((long)plVar2 + lVar4 + 0x50c) < iVar3) {
          *(int *)((long)plVar2 + lVar4 + 0x50c) = iVar3;
        }
        if (local_34 < *(int *)((long)plVar2 + lVar4 + 0x50c)) {
          local_34 = *(int *)((long)plVar2 + lVar4 + 0x50c);
        }
      }
      *(int *)((long)plVar2 + 0x14) = local_34;
    }
  }
  else {
    for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
      local_1c = 0;
      local_28 = *(double *)(*(long *)(in_RDI + 0x140) + (long)local_14 * 0x200) * 1.00001;
      for (local_18 = 1; local_18 < 0x40; local_18 = local_18 + 1) {
        dVar1 = *(double *)(*(long *)(in_RDI + 0x140) + (long)local_14 * 0x200 + (long)local_18 * 8)
        ;
        if (local_28 < dVar1) {
          local_1c = local_18;
          local_28 = dVar1;
        }
      }
      *(int *)((long)plVar2 + (long)local_14 * 0x2e8 + 0x50c) = local_1c;
    }
  }
  return;
}

Assistant:

void VP8AdjustFilterStrength(VP8EncIterator* const it) {
  VP8Encoder* const enc = it->enc;
#if !defined(WEBP_REDUCE_SIZE)
  if (it->lf_stats != NULL) {
    int s;
    for (s = 0; s < NUM_MB_SEGMENTS; s++) {
      int i, best_level = 0;
      // Improvement over filter level 0 should be at least 1e-5 (relatively)
      double best_v = 1.00001 * (*it->lf_stats)[s][0];
      for (i = 1; i < MAX_LF_LEVELS; i++) {
        const double v = (*it->lf_stats)[s][i];
        if (v > best_v) {
          best_v = v;
          best_level = i;
        }
      }
      enc->dqm[s].fstrength = best_level;
    }
    return;
  }
#endif  // !defined(WEBP_REDUCE_SIZE)
  if (enc->config->filter_strength > 0) {
    int max_level = 0;
    int s;
    for (s = 0; s < NUM_MB_SEGMENTS; s++) {
      VP8SegmentInfo* const dqm = &enc->dqm[s];
      // this '>> 3' accounts for some inverse WHT scaling
      const int delta = (dqm->max_edge * dqm->y2.q[1]) >> 3;
      const int level =
          VP8FilterStrengthFromDelta(enc->filter_hdr.sharpness, delta);
      if (level > dqm->fstrength) {
        dqm->fstrength = level;
      }
      if (max_level < dqm->fstrength) {
        max_level = dqm->fstrength;
      }
    }
    enc->filter_hdr.level = max_level;
  }
}